

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O2

void prmon::snip_string_and_test
               (char *env_string,uint start,uint pos,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *disabled_monitors)

{
  bool bVar1;
  string monitor_name;
  value_type local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,env_string + start,env_string + start + (pos - start));
  std::__cxx11::string::string((string *)&local_38,(string *)&local_58);
  bVar1 = valid_monitor_disable(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(disabled_monitors,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void snip_string_and_test(char *env_string, unsigned start, unsigned pos,
                          std::vector<std::string> &disabled_monitors) {
  std::string monitor_name(env_string + start, pos - start);
  if (valid_monitor_disable(monitor_name))
    disabled_monitors.push_back(monitor_name);
}